

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O1

TInfoSinkBase * __thiscall glslang::TInfoSinkBase::operator<<(TInfoSinkBase *this,int n)

{
  size_t sVar1;
  char text [16];
  char acStack_58 [24];
  TString local_40;
  
  snprintf(acStack_58,0x10,"%d",n);
  local_40._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_40,
             acStack_58,acStack_58 + sVar1);
  append(this,&local_40);
  return this;
}

Assistant:

TInfoSinkBase& operator<<(int n)                   { append(String(n)); return *this; }